

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetLinkDirectories
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config,string *language)

{
  cmMakefile *this_00;
  string *psVar1;
  cmLocalGenerator *this_01;
  pointer this_02;
  bool *pbVar2;
  pointer pEVar3;
  PolicyStatus PVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var5;
  ostream *poVar6;
  string *psVar7;
  undefined8 *puVar8;
  cmake *this_03;
  string *psVar9;
  long *plVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long *plVar12;
  size_type *psVar13;
  PolicyID id;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  pointer pEVar14;
  bool bVar15;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar16;
  MessageType local_38c;
  string local_388;
  undefined4 local_364;
  cmGeneratorTarget *local_360;
  string usedDirectories;
  long *local_330;
  long local_328;
  long local_320 [2];
  pointer local_310;
  string *local_308;
  long *local_300;
  long local_2f8;
  long local_2f0;
  long lStack_2e8;
  long local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  EvaluatedTargetPropertyEntries entries;
  string local_280;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [6];
  ios_base local_1f0 [264];
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueDirectories;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uniqueDirectories._M_h._M_buckets = &uniqueDirectories._M_h._M_single_bucket;
  uniqueDirectories._M_h._M_bucket_count = 1;
  uniqueDirectories._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueDirectories._M_h._M_element_count = 0;
  uniqueDirectories._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueDirectories._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueDirectories._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"LINK_DIRECTORIES","");
  cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
            (&dagChecker,this,&local_280,(GeneratorExpressionContent *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = this->Makefile;
  _e = (pointer)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"CMAKE_DEBUG_TARGET_PROPERTIES","");
  cmMakefile::GetDefExpandList(this_00,(string *)&e,&debugProperties,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
  }
  if (this->DebugLinkDirectoriesDone == false) {
    _Var5 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[17]>>
                      (debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       debugProperties.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"LINK_DIRECTORIES");
    local_364 = (undefined4)
                CONCAT71((int7)((ulong)_Var5._M_current >> 8),
                         _Var5._M_current !=
                         debugProperties.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    local_364 = 0;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    this->DebugLinkDirectoriesDone = true;
  }
  anon_unknown.dwarf_164fc7f::EvaluateTargetPropertyEntries
            (&entries,this,config,language,&dagChecker,&this->LinkDirectoriesEntries);
  _e = (pointer)local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&e,"INTERFACE_LINK_DIRECTORIES","");
  PVar4 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0099);
  anon_unknown.dwarf_164fc7f::AddInterfaceEntries
            (this,config,(string *)&e,language,&dagChecker,&entries,Yes,(uint)(PVar4 == NEW));
  local_360 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_e != local_250) {
    operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
  }
  pEVar3 = entries.Entries.
           super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pEVar14 = entries.Entries.
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_308 = cmLinkItem::AsStr_abi_cxx11_(&pEVar14->LinkImplItem->super_cmLinkItem);
      usedDirectories._M_string_length = 0;
      usedDirectories.field_2._M_local_buf[0] = '\0';
      psVar9 = (pEVar14->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = (pEVar14->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      bVar15 = psVar9 == psVar1;
      usedDirectories._M_dataplus._M_p = (pointer)&usedDirectories.field_2;
      local_310 = pEVar14;
      if (!bVar15) {
        do {
          bVar15 = cmsys::SystemTools::FileIsFullPath(psVar9);
          if (!bVar15) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            if (local_308->_M_string_length == 0) {
              PVar4 = cmPolicies::PolicyMap::Get(&this->PolicyMap,CMP0081);
              local_38c = FATAL_ERROR;
              if (PVar4 == OLD) {
                bVar15 = true;
              }
              else {
                if (PVar4 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_388,(cmPolicies *)0x51,id);
                  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)&e,local_388._M_dataplus._M_p,
                                      local_388._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_388._M_dataplus._M_p != &local_388.field_2) {
                    operator_delete(local_388._M_dataplus._M_p,
                                    local_388.field_2._M_allocated_capacity + 1);
                  }
                  local_38c = AUTHOR_WARNING;
                }
                bVar15 = false;
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"Found relative path while evaluating link directories of \""
                         ,0x3a);
              psVar7 = cmTarget::GetName_abi_cxx11_(local_360->Target);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&e,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":\n  \"",6);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&e,"Target \"",8);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&e,(local_308->_M_dataplus)._M_p,
                                  local_308->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar6,"\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \""
                         ,0x3f);
              poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar6,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
              local_38c = FATAL_ERROR;
              bVar15 = false;
            }
            if (!bVar15) {
              this_01 = local_360->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(this_01,local_38c,&local_388);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p,
                                local_388.field_2._M_allocated_capacity + 1);
              }
              if (local_38c == FATAL_ERROR) {
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
                std::ios_base::~ios_base(local_1f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)usedDirectories._M_dataplus._M_p != &usedDirectories.field_2) {
                  operator_delete(usedDirectories._M_dataplus._M_p,
                                  CONCAT71(usedDirectories.field_2._M_allocated_capacity._1_7_,
                                           usedDirectories.field_2._M_local_buf[0]) + 1);
                }
                goto LAB_003e7420;
              }
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
            std::ios_base::~ios_base(local_1f0);
          }
          cmsys::SystemTools::ConvertToUnixSlashes(psVar9);
          _e = (pointer)&uniqueDirectories;
          pVar16 = std::
                   _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                             ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)&uniqueDirectories,psVar9,&e);
          if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       __return_storage_ptr__,psVar9,&pEVar14->Backtrace);
            if ((char)local_364 != '\0') {
              std::operator+(&local_388," * ",psVar9);
              puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_388);
              paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar8 == paVar11) {
                local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
                local_250[0]._8_8_ = puVar8[3];
                _e = (pointer)local_250;
              }
              else {
                local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
                _e = (pointer)*puVar8;
              }
              *puVar8 = paVar11;
              puVar8[1] = 0;
              *(undefined1 *)(puVar8 + 2) = 0;
              std::__cxx11::string::_M_append((char *)&usedDirectories,(ulong)_e);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_e != local_250) {
                operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p,
                                local_388.field_2._M_allocated_capacity + 1);
              }
            }
          }
          psVar9 = psVar9 + 1;
          bVar15 = psVar9 == psVar1;
        } while (!bVar15);
      }
      pEVar14 = local_310;
      if (usedDirectories._M_string_length != 0) {
        this_03 = cmLocalGenerator::GetCMakeInstance(local_360->LocalGenerator);
        local_330 = local_320;
        local_2e0 = 0x21;
        local_330 = (long *)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_2e0);
        local_320[0] = local_2e0;
        local_330[2] = 0x6f6620736569726f;
        local_330[3] = 0x7465677261742072;
        *local_330 = 0x6e696c2064657355;
        local_330[1] = 0x746365726964206b;
        *(char *)(local_330 + 4) = ' ';
        local_328 = local_2e0;
        *(char *)((long)local_330 + local_2e0) = '\0';
        psVar9 = cmTarget::GetName_abi_cxx11_(local_360->Target);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_330,(ulong)(psVar9->_M_dataplus)._M_p);
        local_300 = &local_2f0;
        plVar12 = plVar10 + 2;
        if ((long *)*plVar10 == plVar12) {
          local_2f0 = *plVar12;
          lStack_2e8 = plVar10[3];
        }
        else {
          local_2f0 = *plVar12;
          local_300 = (long *)*plVar10;
        }
        local_2f8 = plVar10[1];
        *plVar10 = (long)plVar12;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_300);
        psVar13 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_388.field_2._M_allocated_capacity = *psVar13;
          local_388.field_2._8_8_ = plVar10[3];
          local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
        }
        else {
          local_388.field_2._M_allocated_capacity = *psVar13;
          local_388._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_388._M_string_length = plVar10[1];
        *plVar10 = (long)psVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_388,(ulong)usedDirectories._M_dataplus._M_p);
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 == paVar11) {
          local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
          local_250[0]._8_8_ = puVar8[3];
          _e = (pointer)local_250;
        }
        else {
          local_250[0]._0_8_ = paVar11->_M_allocated_capacity;
          _e = (pointer)*puVar8;
        }
        *puVar8 = paVar11;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        cmake::IssueMessage(this_03,LOG,(string *)&e,&pEVar14->Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_e != local_250) {
          operator_delete(_e,local_250[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_388._M_dataplus._M_p != &local_388.field_2) {
          operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        }
        if (local_300 != &local_2f0) {
          operator_delete(local_300,local_2f0 + 1);
        }
        if (local_330 != local_320) {
          operator_delete(local_330,local_320[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)usedDirectories._M_dataplus._M_p != &usedDirectories.field_2) {
        operator_delete(usedDirectories._M_dataplus._M_p,
                        CONCAT71(usedDirectories.field_2._M_allocated_capacity._1_7_,
                                 usedDirectories.field_2._M_local_buf[0]) + 1);
      }
      pEVar14 = pEVar14 + 1;
    } while ((bool)(bVar15 & pEVar14 != pEVar3));
  }
LAB_003e7420:
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_04 = &(entries.Entries.
                super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                ._M_impl.super__Vector_impl_data._M_start)->Values;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_04);
      this_02 = (pointer)(((EvaluatedTargetPropertyEntry *)(this_04 + -1))->Backtrace).
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
      if (this_02 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
      }
      pbVar2 = (bool *)(this_04 + 1);
      this_04 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_04[2].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
    } while ((pointer)(pbVar2 + 8) !=
             entries.Entries.
             super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (entries.Entries.
      super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(entries.Entries.
                    super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)entries.Entries.
                          super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  if (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (dagChecker.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&dagChecker.Seen._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
    operator_delete(dagChecker.Property._M_dataplus._M_p,
                    dagChecker.Property.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&uniqueDirectories._M_h);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetLinkDirectories(
  std::string const& config, std::string const& language) const
{
  std::vector<BT<std::string>> result;
  std::unordered_set<std::string> uniqueDirectories;

  cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_DIRECTORIES", nullptr,
                                             nullptr);

  std::vector<std::string> debugProperties;
  this->Makefile->GetDefExpandList("CMAKE_DEBUG_TARGET_PROPERTIES",
                                   debugProperties);

  bool debugDirectories = !this->DebugLinkDirectoriesDone &&
    cm::contains(debugProperties, "LINK_DIRECTORIES");

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugLinkDirectoriesDone = true;
  }

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, language, &dagChecker, this->LinkDirectoriesEntries);

  AddInterfaceEntries(this, config, "INTERFACE_LINK_DIRECTORIES", language,
                      &dagChecker, entries, IncludeRuntimeInterface::Yes,
                      this->GetPolicyStatusCMP0099() == cmPolicies::NEW
                        ? LinkInterfaceFor::Link
                        : LinkInterfaceFor::Usage);

  processLinkDirectories(this, entries, result, uniqueDirectories,
                         debugDirectories);

  return result;
}